

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::RemoveLogSink(LogSink *destination)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)LogDestination::sink_mutex_);
  if (LogDestination::sinks_ != (long *)0x0) {
    lVar1 = *LogDestination::sinks_;
    uVar2 = (ulong)(LogDestination::sinks_[1] - lVar1) >> 3 & 0xffffffff;
    do {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) goto LAB_00116471;
      uVar3 = (ulong)((uint)uVar2 & 0x7fffffff);
    } while (*(LogSink **)(lVar1 + uVar3 * 8) != destination);
    *(undefined8 *)(lVar1 + uVar3 * 8) =
         *(undefined8 *)(lVar1 + -8 + (LogDestination::sinks_[1] - lVar1));
    LogDestination::sinks_[1] = LogDestination::sinks_[1] + -8;
  }
LAB_00116471:
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)LogDestination::sink_mutex_);
  return;
}

Assistant:

void RemoveLogSink(LogSink *destination) {
  LogDestination::RemoveLogSink(destination);
}